

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

void __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
          (SquareMatrix<std::complex<double>_> *this,int64_t size,complex<double> value)

{
  complex<double> value_00;
  int64_t size_local;
  SquareMatrix<std::complex<double>_> *this_local;
  complex<double> value_local;
  
  value_00._M_value._8_8_ = value._M_value._0_8_;
  this->size_ = size;
  value_00._M_value._0_8_ = size * size;
  init_unique_array<std::complex<double>>((int64_t)&this->data_,value_00);
  if (0 < size) {
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0x35,
                "qclab::dense::SquareMatrix<std::complex<double>>::SquareMatrix(const int64_t, const T) [T = std::complex<double>]"
               );
}

Assistant:

SquareMatrix( const int64_t size , const T value )
        : size_( size )
        , data_( init_unique_array< T >( size * size , value ) )
        {
          assert( size > 0 ) ;
        }